

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O2

bool duckdb::LikeOperatorFunction(string_t *s,string_t *pat)

{
  bool bVar1;
  ulong plen;
  ulong slen;
  char *s_00;
  
  slen = (ulong)(s->value).pointer.length;
  if (slen < 0xd) {
    s_00 = (s->value).pointer.prefix;
  }
  else {
    s_00 = (s->value).pointer.ptr;
  }
  plen = (ulong)(pat->value).pointer.length;
  if (0xc < plen) {
    bVar1 = LikeOperatorFunction(s_00,slen,(pat->value).pointer.ptr,plen);
    return bVar1;
  }
  bVar1 = LikeOperatorFunction(s_00,slen,(pat->value).pointer.prefix,plen);
  return bVar1;
}

Assistant:

bool LikeOperatorFunction(string_t &s, string_t &pat) {
	return LikeOperatorFunction(s.GetData(), s.GetSize(), pat.GetData(), pat.GetSize());
}